

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

CURLcode Curl_resolv_check(connectdata *conn,Curl_dns_entry **dns)

{
  Curl_easy *pCVar1;
  void *pvVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  CURLcode CVar5;
  int iVar6;
  timediff_t tVar7;
  long lVar8;
  char *pcVar9;
  bool bVar10;
  curltime cVar11;
  curltime newer;
  curltime older;
  
  if (((conn->data->set).field_0x916 & 0x80) != 0) {
    CVar5 = Curl_doh_is_resolved(conn,dns);
    return CVar5;
  }
  pCVar1 = conn->data;
  pvVar2 = (conn->async).os_specific;
  *dns = (Curl_dns_entry *)0x0;
  if (pvVar2 == (void *)0x0) {
    return CURLE_COULDNT_RESOLVE_HOST;
  }
  pthread_mutex_lock(*(pthread_mutex_t **)((long)pvVar2 + 0x18));
  iVar6 = *(int *)((long)pvVar2 + 0x20);
  pthread_mutex_unlock(*(pthread_mutex_t **)((long)pvVar2 + 0x18));
  if (iVar6 != 0) {
    pvVar2 = (conn->async).os_specific;
    Curl_addrinfo_callback
              (conn,*(int *)((long)pvVar2 + 0x48),*(Curl_addrinfo **)((long)pvVar2 + 0x50));
    *(undefined8 *)((long)pvVar2 + 0x50) = 0;
    if ((conn->async).dns != (Curl_dns_entry *)0x0) {
      destroy_async_data(&conn->async);
      *dns = (conn->async).dns;
      return CURLE_OK;
    }
    bVar10 = ((conn->bits).field_0x4 & 0x40) == 0;
    pcVar9 = "proxy";
    if (bVar10) {
      pcVar9 = "host";
    }
    Curl_failf(conn->data,"Could not resolve %s: %s",pcVar9,(conn->async).hostname);
    destroy_async_data(&conn->async);
    return bVar10 + CURLE_COULDNT_RESOLVE_PROXY;
  }
  cVar11 = Curl_now();
  uVar3 = (pCVar1->progress).t_startsingle.tv_sec;
  uVar4 = (pCVar1->progress).t_startsingle.tv_usec;
  older.tv_usec = uVar4;
  older.tv_sec = uVar3;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar11._0_12_,0);
  newer.tv_usec = SUB124(cVar11._0_12_,8);
  older._12_4_ = 0;
  tVar7 = Curl_timediff(newer,older);
  lVar8 = 0;
  if (0 < tVar7) {
    lVar8 = tVar7;
  }
  if (*(int *)((long)pvVar2 + 8) == 0) {
    iVar6 = 1;
  }
  else {
    if (lVar8 < *(long *)((long)pvVar2 + 0x10)) goto LAB_0013a3b9;
    iVar6 = *(int *)((long)pvVar2 + 8) * 2;
  }
  *(int *)((long)pvVar2 + 8) = iVar6;
LAB_0013a3b9:
  if (0xfa < *(uint *)((long)pvVar2 + 8)) {
    *(undefined4 *)((long)pvVar2 + 8) = 0xfa;
  }
  *(ulong *)((long)pvVar2 + 0x10) = lVar8 + (ulong)*(uint *)((long)pvVar2 + 8);
  Curl_expire(conn->data,(ulong)*(uint *)((long)pvVar2 + 8),EXPIRE_ASYNC_NAME);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_resolv_check(struct connectdata *conn,
                           struct Curl_dns_entry **dns)
{
#if defined(CURL_DISABLE_DOH) && !defined(CURLRES_ASYNCH)
  (void)dns;
#endif

  if(conn->data->set.doh)
    return Curl_doh_is_resolved(conn, dns);
  return Curl_resolver_is_resolved(conn, dns);
}